

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O0

void __thiscall D2xNvmFlash::writeOptions(D2xNvmFlash *this)

{
  bool bVar1;
  const_reference cVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  byte *pbVar6;
  vector<bool,_std::allocator<bool>_> *pvVar7;
  size_type sVar8;
  type puVar9;
  bool *pbVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  iterator iVar13;
  _Bit_iterator __first2;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __last1;
  uint32_t local_18c;
  uint local_c0;
  uint local_bc;
  uint32_t offset;
  uint32_t region;
  uint8_t *lockBits;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> current;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_18;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> userRow;
  D2xNvmFlash *this_local;
  
  userRow._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)this;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&local_18);
  uVar3 = (*(this->super_Flash)._vptr_Flash[0x13])();
  if (((uVar3 & 1) != 0) && (bVar1 = FlashOption<bool>::isDirty(&(this->super_Flash)._bor), bVar1))
  {
    pbVar10 = FlashOption<bool>::get(&(this->super_Flash)._bor);
    bVar1 = *pbVar10;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0x11])();
    if ((bVar1 & 1U) != ((byte)iVar5 & 1)) {
      readUserRow(this,&local_18);
      pbVar10 = FlashOption<bool>::get(&(this->super_Flash)._bor);
      if ((*pbVar10 & 1U) == 0) {
        pbVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&local_18,1);
        *pbVar6 = *pbVar6 & 0xf8;
      }
      else {
        pbVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&local_18,1);
        *pbVar6 = *pbVar6 | 7;
      }
    }
  }
  uVar3 = (*(this->super_Flash)._vptr_Flash[0x10])();
  if (((uVar3 & 1) != 0) && (bVar1 = FlashOption<bool>::isDirty(&(this->super_Flash)._bod), bVar1))
  {
    pbVar10 = FlashOption<bool>::get(&(this->super_Flash)._bod);
    bVar1 = *pbVar10;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0xe])();
    if ((bVar1 & 1U) != ((byte)iVar5 & 1)) {
      readUserRow(this,&local_18);
      pbVar10 = FlashOption<bool>::get(&(this->super_Flash)._bod);
      if ((*pbVar10 & 1U) == 0) {
        pbVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&local_18,1);
        *pbVar6 = *pbVar6 & 0xf9;
      }
      else {
        pbVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&local_18,1);
        *pbVar6 = *pbVar6 | 6;
      }
    }
  }
  bVar1 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::isDirty
                    (&(this->super_Flash)._regions);
  if (bVar1) {
    (*(this->super_Flash)._vptr_Flash[10])(local_50);
    pvVar7 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::get
                       (&(this->super_Flash)._regions);
    cVar11 = std::vector<bool,_std::allocator<bool>_>::begin(pvVar7);
    pvVar7 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::get
                       (&(this->super_Flash)._regions);
    cVar12 = std::vector<bool,_std::allocator<bool>_>::end(pvVar7);
    iVar13 = std::vector<bool,_std::allocator<bool>_>::begin
                       ((vector<bool,_std::allocator<bool>_> *)local_50);
    __first2.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar13.super__Bit_iterator_base._0_12_,0);
    __first2.super__Bit_iterator_base._M_offset = SUB124(iVar13.super__Bit_iterator_base._0_12_,8);
    __first1.super__Bit_iterator_base._12_4_ = 0;
    __first1.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(cVar11.super__Bit_iterator_base._0_12_,0);
    __first1.super__Bit_iterator_base._M_offset = SUB124(cVar11.super__Bit_iterator_base._0_12_,8);
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __last1.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(cVar12.super__Bit_iterator_base._0_12_,0);
    __last1.super__Bit_iterator_base._M_offset = SUB124(cVar12.super__Bit_iterator_base._0_12_,8);
    bVar1 = std::equal<std::_Bit_const_iterator,std::_Bit_iterator>(__first1,__last1,__first2);
    if (!bVar1) {
      readUserRow(this,&local_18);
      puVar9 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&local_18,6);
      local_bc = 0;
      while( true ) {
        pvVar7 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::get
                           (&(this->super_Flash)._regions);
        sVar8 = std::vector<bool,_std::allocator<bool>_>::size(pvVar7);
        if (sVar8 <= local_bc) break;
        pvVar7 = FlashOption<std::vector<bool,_std::allocator<bool>_>_>::get
                           (&(this->super_Flash)._regions);
        cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar7,(ulong)local_bc);
        if (cVar2) {
          puVar9[local_bc >> 3] = puVar9[local_bc >> 3] & ((byte)(1 << ((byte)local_bc & 7)) ^ 0xff)
          ;
        }
        else {
          puVar9[local_bc >> 3] = puVar9[local_bc >> 3] | (byte)(1 << ((byte)local_bc & 7));
        }
        local_bc = local_bc + 1;
      }
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_50);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18);
  if (bVar1) {
    uVar4 = readReg(this,'\x04');
    writeReg(this,'\x04',uVar4 | 0x40080);
    writeReg(this,'\x1c',0x402000);
    command(this,'\x05');
    for (local_c0 = 0; local_c0 < (this->super_Flash)._size << 2;
        local_c0 = (this->super_Flash)._size + local_c0) {
      puVar9 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&local_18,(ulong)local_c0);
      (*(this->super_Flash)._vptr_Flash[0x1b])(this,puVar9,(ulong)(ushort)(this->super_Flash)._size)
      ;
      command(this,'D');
      WordCopyApplet::setDstAddr(&(this->super_Flash)._wordCopy,local_c0 + 0x804000);
      if (((this->super_Flash)._onBufferA & 1U) == 0) {
        local_18c = (this->super_Flash)._pageBufferB;
      }
      else {
        local_18c = (this->super_Flash)._pageBufferA;
      }
      WordCopyApplet::setSrcAddr(&(this->super_Flash)._wordCopy,local_18c);
      (this->super_Flash)._onBufferA = (bool)(~(this->super_Flash)._onBufferA & 1);
      waitReady(this);
      Applet::runv(&(this->super_Flash)._wordCopy.super_Applet);
      writeReg(this,'\x1c',local_c0 + 0x804000 >> 1);
      command(this,'\x06');
    }
  }
  bVar1 = FlashOption<bool>::isDirty(&(this->super_Flash)._security);
  if ((bVar1) &&
     (pbVar10 = FlashOption<bool>::get(&(this->super_Flash)._security), (*pbVar10 & 1U) == 1)) {
    pbVar10 = FlashOption<bool>::get(&(this->super_Flash)._security);
    bVar1 = *pbVar10;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0xc])();
    if ((bVar1 & 1U) != ((byte)iVar5 & 1)) {
      command(this,'E');
    }
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

void
D2xNvmFlash::writeOptions()
{
    std::unique_ptr<uint8_t[]> userRow;

    if (canBor() && _bor.isDirty() && _bor.get() != getBor())
    {
        readUserRow(userRow);
        if (_bor.get())
            userRow[NVM_UR_BOD33_RESET_OFFSET] |= NVM_UR_BOD33_RESET_MASK;
        else
            userRow[NVM_UR_BOD33_RESET_OFFSET] &= ~NVM_UR_BOD33_RESET_MASK;
    }
    if (canBod() && _bod.isDirty() && _bod.get() != getBod())
    {
        readUserRow(userRow);
        if (_bod.get())
            userRow[NVM_UR_BOD33_ENABLE_OFFSET] |= NVM_UR_BOD33_ENABLE_MASK;
        else
            userRow[NVM_UR_BOD33_ENABLE_OFFSET] &= ~NVM_UR_BOD33_ENABLE_MASK;
    }
    if (_regions.isDirty())
    {
        // Check if any lock bits are different from the current set
        std::vector<bool> current = getLockRegions();
        if (!equal(_regions.get().begin(), _regions.get().end(), current.begin()))
        {
            readUserRow(userRow);

            uint8_t* lockBits = &userRow[NVM_UR_NVM_LOCK_OFFSET];
            for (uint32_t region = 0; region < _regions.get().size(); region++)
            {
                if (_regions.get()[region])
                    lockBits[region / 8] &= ~(1 << (region % 8));
                else
                    lockBits[region / 8] |= (1 << (region % 8));
            }
        }
    }

    // Erase and write the user row if modified
    if (userRow)
    {
        // Disable cache and configure manual page write
        writeReg(NVM_REG_CTRLB, readReg(NVM_REG_CTRLB) | (0x1 << 18) | (0x1 << 7));

        // Erase user row
        writeReg(NVM_REG_ADDR, NVM_UR_ADDR / 2);
        command(NVM_CMD_EAR);

        // Write user row in page chunks
        for (uint32_t offset = 0; offset < NVM_UR_SIZE; offset += _size)
        {
            // Load the buffer with the page
            loadBuffer(&userRow[offset], _size);

            // Clear page buffer
            command(NVM_CMD_PBC);

            // Copy page to page buffer
            _wordCopy.setDstAddr(NVM_UR_ADDR + offset);
            _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
            _onBufferA = !_onBufferA;
            waitReady();
            _wordCopy.runv();

            // Write the page
            writeReg(NVM_REG_ADDR, (NVM_UR_ADDR + offset) / 2);
            command(NVM_CMD_WAP);
        }
    }

    // Always do security last
    if (_security.isDirty() && _security.get() == true && _security.get() != getSecurity())
    {
        command(NVM_CMD_SSB);
    }
}